

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_br_fillup(lzh_stream *strm,lzh_br *br)

{
  uint64_t uVar1;
  byte *pbVar2;
  ulong *puVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  wchar_t wVar7;
  int iVar8;
  
  wVar7 = br->cache_avail;
  iVar5 = -wVar7;
  do {
    wVar7 = wVar7 + L'\b';
    switch(iVar5 + 0x40 >> 3) {
    case 0:
      return L'\x01';
    default:
      lVar6 = strm->avail_in;
      break;
    case 6:
      lVar6 = strm->avail_in;
      if (5 < lVar6) {
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[5] |
             (ulong)pbVar2[4] << 8 |
             (ulong)pbVar2[3] << 0x10 |
             (ulong)pbVar2[2] << 0x18 |
             (ulong)pbVar2[1] << 0x20 | (ulong)*pbVar2 << 0x28 | br->cache_buffer << 0x30;
        strm->next_in = pbVar2 + 6;
        lVar6 = lVar6 + -6;
        iVar8 = 0x30;
LAB_0040f81c:
        strm->avail_in = lVar6;
        br->cache_avail = iVar8 - iVar5;
        return L'\x01';
      }
      break;
    case 7:
      lVar6 = strm->avail_in;
      if (6 < lVar6) {
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[6] |
             (ulong)pbVar2[5] << 8 |
             (ulong)pbVar2[4] << 0x10 |
             (ulong)pbVar2[3] << 0x18 |
             (ulong)pbVar2[2] << 0x20 |
             (ulong)pbVar2[1] << 0x28 | (ulong)*pbVar2 << 0x30 | br->cache_buffer << 0x38;
        strm->next_in = pbVar2 + 7;
        lVar6 = lVar6 + -7;
        iVar8 = 0x38;
        goto LAB_0040f81c;
      }
      break;
    case 8:
      lVar6 = strm->avail_in;
      if (7 < lVar6) {
        puVar3 = (ulong *)strm->next_in;
        uVar4 = *puVar3;
        br->cache_buffer =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        strm->next_in = (uchar *)(puVar3 + 1);
        lVar6 = lVar6 + -8;
        iVar8 = 0x40;
        goto LAB_0040f81c;
      }
    }
    if (lVar6 == 0) {
      return L'\0';
    }
    uVar1 = br->cache_buffer;
    pbVar2 = strm->next_in;
    strm->next_in = pbVar2 + 1;
    br->cache_buffer = (ulong)*pbVar2 | uVar1 << 8;
    strm->avail_in = lVar6 + -1;
    br->cache_avail = wVar7;
    iVar5 = iVar5 + -8;
  } while( true );
}

Assistant:

static int
lzh_br_fillup(struct lzh_stream *strm, struct lzh_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 3) {
		case 8:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[0]) << 56 |
				    ((uint64_t)strm->next_in[1]) << 48 |
				    ((uint64_t)strm->next_in[2]) << 40 |
				    ((uint64_t)strm->next_in[3]) << 32 |
				    ((uint32_t)strm->next_in[4]) << 24 |
				    ((uint32_t)strm->next_in[5]) << 16 |
				    ((uint32_t)strm->next_in[6]) << 8 |
				     (uint32_t)strm->next_in[7];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 7:
			if (strm->avail_in >= 7) {
				br->cache_buffer =
		 		   (br->cache_buffer << 56) |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 7;
				strm->avail_in -= 7;
				br->cache_avail += 7 * 8;
				return (1);
			}
			break;
		case 6:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[0]) << 40 |
				    ((uint64_t)strm->next_in[1]) << 32 |
				    ((uint32_t)strm->next_in[2]) << 24 |
				    ((uint32_t)strm->next_in[3]) << 16 |
				    ((uint32_t)strm->next_in[4]) << 8 |
				     (uint32_t)strm->next_in[5];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/ 
			return (1);
		default:
			break;
		}
		if (strm->avail_in == 0) {
			/* There is not enough compressed data to fill up the
			 * cache buffer. */
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 8) | *strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 8;
		n -= 8;
	}
}